

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGDefaultTypeCompare
              (void *data,xmlChar *type,xmlChar *value1,xmlNodePtr ctxt1,void *comp1,xmlChar *value2
              ,xmlNodePtr ctxt2)

{
  int iVar1;
  xmlChar *str1;
  xmlChar *str2;
  uint uVar2;
  
  iVar1 = xmlStrEqual(type,"string");
  if (iVar1 != 0) {
    iVar1 = xmlStrEqual(value1,value2);
    return iVar1;
  }
  iVar1 = xmlStrEqual(type,(xmlChar *)"token");
  if (iVar1 == 0) {
    return -1;
  }
  iVar1 = xmlStrEqual(value1,value2);
  if (iVar1 != 0) {
    return 1;
  }
  str1 = xmlRelaxNGNormalize((xmlRelaxNGValidCtxtPtr)0x0,value1);
  str2 = xmlRelaxNGNormalize((xmlRelaxNGValidCtxtPtr)0x0,value2);
  if (str2 == (xmlChar *)0x0 || str1 == (xmlChar *)0x0) {
    uVar2 = 0xffffffff;
    if (str1 == (xmlChar *)0x0) goto LAB_001781b1;
  }
  else {
    iVar1 = xmlStrEqual(str1,str2);
    uVar2 = (uint)(iVar1 != 0);
  }
  (*xmlFree)(str1);
LAB_001781b1:
  if (str2 != (xmlChar *)0x0) {
    (*xmlFree)(str2);
  }
  return uVar2;
}

Assistant:

static int
xmlRelaxNGDefaultTypeCompare(void *data ATTRIBUTE_UNUSED,
                             const xmlChar * type,
                             const xmlChar * value1,
                             xmlNodePtr ctxt1 ATTRIBUTE_UNUSED,
                             void *comp1 ATTRIBUTE_UNUSED,
                             const xmlChar * value2,
                             xmlNodePtr ctxt2 ATTRIBUTE_UNUSED)
{
    int ret = -1;

    if (xmlStrEqual(type, BAD_CAST "string")) {
        ret = xmlStrEqual(value1, value2);
    } else if (xmlStrEqual(type, BAD_CAST "token")) {
        if (!xmlStrEqual(value1, value2)) {
            xmlChar *nval, *nvalue;

            /*
             * TODO: trivial optimizations are possible by
             * computing at compile-time
             */
            nval = xmlRelaxNGNormalize(NULL, value1);
            nvalue = xmlRelaxNGNormalize(NULL, value2);

            if ((nval == NULL) || (nvalue == NULL))
                ret = -1;
            else if (xmlStrEqual(nval, nvalue))
                ret = 1;
            else
                ret = 0;
            if (nval != NULL)
                xmlFree(nval);
            if (nvalue != NULL)
                xmlFree(nvalue);
        } else
            ret = 1;
    }
    return (ret);
}